

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfusionstyle.cpp
# Opt level: O0

void qt_fusion_draw_arrow
               (ArrowType type,QPainter *painter,QStyleOption *option,QRect *rect,QColor *color)

{
  qreal qVar1;
  QRect paintRect;
  bool bVar2;
  uint t;
  int iVar3;
  int iVar4;
  int *piVar5;
  QPainter *pQVar6;
  pointer pvVar7;
  size_type sVar8;
  undefined8 *in_RCX;
  undefined8 in_RSI;
  uint in_EDI;
  undefined8 *in_R8;
  long in_FS_OFFSET;
  QPointF QVar9;
  int size;
  qreal dpi;
  QRectF arrowRect;
  QString pixmapName;
  int rectMax;
  int arrowMax;
  int arrowHeight;
  int arrowWidth;
  QCachedPainter cp;
  array<QPointF,_3UL> triangle;
  QStyleOption *in_stack_fffffffffffffc88;
  QRect *this;
  QStringBuilder<QLatin1String,_HexString<unsigned_int>_> *in_stack_fffffffffffffc90;
  QCachedPainter *this_00;
  QRectF *in_stack_fffffffffffffc98;
  QRect *in_stack_fffffffffffffca0;
  QStyleOption *in_stack_fffffffffffffcb0;
  QPointF *pQVar10;
  QString *in_stack_fffffffffffffcb8;
  qreal qVar11;
  QPainter *in_stack_fffffffffffffcc0;
  qreal *pqVar12;
  QCachedPainter *in_stack_fffffffffffffcc8;
  QSize in_stack_fffffffffffffd18;
  double dVar13;
  undefined4 in_stack_fffffffffffffd30;
  undefined4 in_stack_fffffffffffffd34;
  QPointF local_278;
  QPointF local_268;
  QPointF local_258;
  QPointF local_248;
  qreal local_238;
  qreal local_230;
  qreal local_228;
  qreal local_220;
  QRectF local_218;
  QRect *local_1f8;
  QCachedPainter *local_1f0;
  HexString<unsigned_int> local_1e8;
  HexString<unsigned_int> local_1e4;
  QLatin1StringView local_1e0;
  undefined1 *local_1d0;
  undefined1 *local_1c8;
  undefined1 *local_1c0;
  int local_1b8;
  int local_1b4;
  int local_1b0;
  int local_1ac;
  int local_1a8;
  int local_1a4;
  undefined8 local_1a0;
  undefined8 local_198;
  QCachedPainter local_190;
  qreal local_f8;
  qreal local_f0;
  qreal local_e8;
  qreal local_e0;
  QPointF QStack_d8;
  qreal local_c8;
  qreal local_c0;
  qreal local_b8;
  qreal local_b0;
  qreal local_98;
  qreal local_90;
  qreal local_88;
  qreal local_80;
  QPointF QStack_78;
  qreal local_68;
  qreal local_60;
  qreal local_58;
  qreal local_50;
  QPointF QStack_48;
  array<QPointF,_3UL> local_38;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  bVar2 = QRect::isEmpty((QRect *)in_stack_fffffffffffffc90);
  if (!bVar2) {
    qVar11 = QStyleHelper::dpi(in_stack_fffffffffffffc88);
    qVar1 = QStyleHelper::dpiScaled(14.0,qVar11);
    local_1a4 = (int)qVar1;
    qVar11 = QStyleHelper::dpiScaled(8.0,qVar11);
    local_1a8 = (int)qVar11;
    piVar5 = qMin<int>(&local_1a8,&local_1a4);
    local_1ac = *piVar5;
    local_1b4 = QRect::height((QRect *)in_stack_fffffffffffffc88);
    local_1b8 = QRect::width((QRect *)in_stack_fffffffffffffc88);
    piVar5 = qMin<int>(&local_1b4,&local_1b8);
    local_1b0 = *piVar5;
    piVar5 = qMin<int>(&local_1ac,&local_1b0);
    iVar3 = *piVar5;
    local_1d0 = &DAT_aaaaaaaaaaaaaaaa;
    local_1c8 = &DAT_aaaaaaaaaaaaaaaa;
    local_1c0 = &DAT_aaaaaaaaaaaaaaaa;
    local_1e0 = Qt::Literals::StringLiterals::operator____L1
                          ((char *)in_stack_fffffffffffffc98,(size_t)in_stack_fffffffffffffc90);
    HexString<unsigned_int>::HexString(&local_1e4,in_EDI);
    operator%(&in_stack_fffffffffffffc90->a,(HexString<unsigned_int> *)in_stack_fffffffffffffc88);
    t = QColor::rgba();
    HexString<unsigned_int>::HexString(&local_1e8,t);
    operator%(in_stack_fffffffffffffc90,(HexString<unsigned_int> *)in_stack_fffffffffffffc88);
    QStringBuilder::operator_cast_to_QString
              ((QStringBuilder<QStringBuilder<QLatin1String,_HexString<unsigned_int>_>,_HexString<unsigned_int>_>
                *)in_stack_fffffffffffffc88);
    memset(&local_190,0xaa,0x60);
    QRect::size(in_stack_fffffffffffffca0);
    this = (QRect *)*in_RCX;
    this_00 = (QCachedPainter *)in_RCX[1];
    paintRect.y1.m_i = in_stack_fffffffffffffd34;
    paintRect.x1.m_i = in_stack_fffffffffffffd30;
    paintRect.x2.m_i = (int)in_RSI;
    paintRect.y2.m_i = (int)((ulong)in_RSI >> 0x20);
    local_1f8 = this;
    local_1f0 = this_00;
    QCachedPainter::QCachedPainter
              (in_stack_fffffffffffffcc8,in_stack_fffffffffffffcc0,in_stack_fffffffffffffcb8,
               in_stack_fffffffffffffcb0,in_stack_fffffffffffffd18,paintRect);
    bVar2 = QCachedPainter::needsPainting(&local_190);
    if (bVar2) {
      local_218.xp = -NAN;
      local_218.yp = -NAN;
      local_218.w = -NAN;
      local_218.h = -NAN;
      QRectF::QRectF(&local_218,0.0,0.0,(double)iVar3,(double)((local_1a8 * iVar3) / local_1a4));
      if ((in_EDI == 3) || (in_EDI == 4)) {
        QRectF::transposed(in_stack_fffffffffffffc98);
        local_218.xp = local_238;
        local_218.yp = local_230;
        local_218.w = local_228;
        local_218.h = local_220;
      }
      iVar3 = QRect::width(this);
      qVar11 = QRectF::width(&local_218);
      dVar13 = 0.5;
      iVar4 = QRect::height(this);
      qVar1 = QRectF::height(&local_218);
      QRectF::moveTo(&local_218,((double)iVar3 - qVar11) * 0.5,((double)iVar4 - qVar1) * dVar13);
      local_38._M_elems[0].xp = -NAN;
      local_38._M_elems[0].yp = -NAN;
      local_38._M_elems[1].xp = -NAN;
      local_38._M_elems[1].yp = -NAN;
      local_38._M_elems[2].xp = -NAN;
      local_38._M_elems[2].yp = -NAN;
      std::array<QPointF,_3UL>::array((array<QPointF,_3UL> *)in_stack_fffffffffffffca0);
      if (in_EDI == 2) {
        QVar9 = QRectF::topLeft(in_stack_fffffffffffffc98);
        local_60 = QVar9.yp;
        local_68 = QVar9.xp;
        QVar9 = QRectF::topRight(in_stack_fffffffffffffc98);
        local_50 = QVar9.yp;
        local_58 = QVar9.xp;
        QVar9 = QRectF::center(in_stack_fffffffffffffc98);
        local_248.yp = QVar9.yp;
        local_248.xp = QVar9.xp;
        qVar11 = QPointF::x(&local_248);
        qVar1 = QRectF::bottom(&local_218);
        QPointF::QPointF(&QStack_48,qVar11,qVar1);
        memcpy(&local_38,&local_68,0x30);
      }
      else if (in_EDI == 3) {
        pqVar12 = &local_c8;
        QVar9 = QRectF::topRight(in_stack_fffffffffffffc98);
        local_c0 = QVar9.yp;
        local_c8 = QVar9.xp;
        QVar9 = QRectF::bottomRight(in_stack_fffffffffffffc98);
        local_b0 = QVar9.yp;
        local_b8 = QVar9.xp;
        pQVar10 = (QPointF *)(pqVar12 + 4);
        qVar11 = QRectF::left(&local_218);
        QVar9 = QRectF::center(in_stack_fffffffffffffc98);
        local_268.yp = QVar9.yp;
        local_268.xp = QVar9.xp;
        qVar1 = QPointF::y(&local_268);
        QPointF::QPointF(pQVar10,qVar11,qVar1);
        memcpy(&local_38,&local_c8,0x30);
      }
      else if (in_EDI == 4) {
        QVar9 = QRectF::topLeft(in_stack_fffffffffffffc98);
        local_90 = QVar9.yp;
        local_98 = QVar9.xp;
        QVar9 = QRectF::bottomLeft(in_stack_fffffffffffffc98);
        local_80 = QVar9.yp;
        local_88 = QVar9.xp;
        qVar11 = QRectF::right(&local_218);
        QVar9 = QRectF::center(in_stack_fffffffffffffc98);
        local_258.yp = QVar9.yp;
        local_258.xp = QVar9.xp;
        qVar1 = QPointF::y(&local_258);
        QPointF::QPointF(&QStack_78,qVar11,qVar1);
        memcpy(&local_38,&local_98,0x30);
      }
      else {
        QVar9 = QRectF::bottomLeft(in_stack_fffffffffffffc98);
        local_f0 = QVar9.yp;
        local_f8 = QVar9.xp;
        QVar9 = QRectF::bottomRight(in_stack_fffffffffffffc98);
        local_e0 = QVar9.yp;
        local_e8 = QVar9.xp;
        pQVar10 = &QStack_d8;
        QVar9 = QRectF::center(in_stack_fffffffffffffc98);
        local_278.yp = QVar9.yp;
        local_278.xp = QVar9.xp;
        qVar11 = QPointF::x(&local_278);
        qVar1 = QRectF::top(&local_218);
        QPointF::QPointF(pQVar10,qVar11,qVar1);
        memcpy(&local_38,&local_f8,0x30);
      }
      pQVar6 = QCachedPainter::operator->((QCachedPainter *)0x4dfbb3);
      QPainter::setPen((PenStyle)pQVar6);
      pQVar6 = QCachedPainter::operator->((QCachedPainter *)0x4dfbca);
      local_1a0 = *in_R8;
      local_198 = in_R8[1];
      QPainter::setBrush((QColor *)pQVar6);
      pQVar6 = QCachedPainter::operator->((QCachedPainter *)0x4dfc0e);
      QPainter::setRenderHint((RenderHint)pQVar6,true);
      pQVar6 = QCachedPainter::operator->((QCachedPainter *)0x4dfc2a);
      pvVar7 = std::array<QPointF,_3UL>::data((array<QPointF,_3UL> *)0x4dfc3c);
      iVar3 = (int)pvVar7;
      sVar8 = std::array<QPointF,_3UL>::size(&local_38);
      QPainter::drawPolygon((QPointF *)pQVar6,iVar3,(FillRule)sVar8);
    }
    QCachedPainter::~QCachedPainter(this_00);
    QString::~QString((QString *)0x4dfc7b);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

static void qt_fusion_draw_arrow(Qt::ArrowType type, QPainter *painter, const QStyleOption *option, const QRect &rect, const QColor &color)
{
    if (rect.isEmpty())
        return;

    const qreal dpi = QStyleHelper::dpi(option);
    const int arrowWidth = int(QStyleHelper::dpiScaled(14, dpi));
    const int arrowHeight = int(QStyleHelper::dpiScaled(8, dpi));

    const int arrowMax = qMin(arrowHeight, arrowWidth);
    const int rectMax = qMin(rect.height(), rect.width());
    const int size = qMin(arrowMax, rectMax);

    const QString pixmapName = "fusion-arrow"_L1
                               % HexString<uint>(type)
                               % HexString<uint>(color.rgba());
    QCachedPainter cp(painter, pixmapName, option, rect.size(), rect);
    if (cp.needsPainting()) {
        QRectF arrowRect(0, 0, size, arrowHeight * size / arrowWidth);
        if (type == Qt::LeftArrow || type == Qt::RightArrow)
            arrowRect = arrowRect.transposed();
        arrowRect.moveTo((rect.width() - arrowRect.width()) / 2.0,
                         (rect.height() - arrowRect.height()) / 2.0);

        std::array<QPointF, 3> triangle;
        switch (type) {
        case Qt::DownArrow:
            triangle = {arrowRect.topLeft(), arrowRect.topRight(), QPointF(arrowRect.center().x(), arrowRect.bottom())};
            break;
        case Qt::RightArrow:
            triangle = {arrowRect.topLeft(), arrowRect.bottomLeft(), QPointF(arrowRect.right(), arrowRect.center().y())};
            break;
        case Qt::LeftArrow:
            triangle = {arrowRect.topRight(), arrowRect.bottomRight(), QPointF(arrowRect.left(), arrowRect.center().y())};
            break;
        default:
            triangle = {arrowRect.bottomLeft(), arrowRect.bottomRight(), QPointF(arrowRect.center().x(), arrowRect.top())};
            break;
        }

        cp->setPen(Qt::NoPen);
        cp->setBrush(color);
        cp->setRenderHint(QPainter::Antialiasing);
        cp->drawPolygon(triangle.data(), int(triangle.size()));
    }
}